

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::VectorArrayBuffer::VectorArrayBuffer
          (VectorArrayBuffer *this,LogicalType *array,idx_t initial)

{
  LogicalType *args;
  idx_t iVar1;
  unsigned_long local_30;
  
  VectorBuffer::VectorBuffer(&this->super_VectorBuffer,ARRAY_BUFFER);
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorArrayBuffer_027a6250;
  args = ArrayType::GetChildType(array);
  iVar1 = ArrayType::GetSize(array);
  local_30 = iVar1 * initial;
  make_uniq<duckdb::Vector,duckdb::LogicalType_const&,unsigned_long>
            ((duckdb *)&this->child,args,&local_30);
  iVar1 = ArrayType::GetSize(array);
  this->array_size = iVar1;
  this->size = initial;
  return;
}

Assistant:

VectorArrayBuffer::VectorArrayBuffer(const LogicalType &array, idx_t initial)
    : VectorBuffer(VectorBufferType::ARRAY_BUFFER),
      child(make_uniq<Vector>(ArrayType::GetChildType(array), initial * ArrayType::GetSize(array))),
      array_size(ArrayType::GetSize(array)), size(initial) {
	// initialize the child array with (array_size * size) ^
	D_ASSERT(!ArrayType::IsAnySize(array));
}